

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

hugeint_t __thiscall
duckdb::Interpolator<false>::
Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>>
          (Interpolator<false> *this,hugeint_t *v_t,Vector *result,
          MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t> *accessor)

{
  bool bVar1;
  QuantileCompare<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>_>
  __comp;
  QuantileCompare<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>_>
  __comp_00;
  QuantileCompare<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>_>
  __comp_01;
  RESULT_TYPE RVar2;
  hugeint_t hVar3;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t hi;
  hugeint_t lo;
  undefined7 uStack_7f;
  undefined7 uStack_67;
  undefined7 uStack_4f;
  hugeint_t local_48;
  hugeint_t local_38;
  
  bVar1 = this->desc;
  if (this->CRN == this->FRN) {
    __comp._17_7_ = uStack_4f;
    __comp.desc = bVar1;
    __comp.accessor_r = accessor;
    __comp.accessor_l = accessor;
    ::std::
    nth_element<duckdb::hugeint_t*,duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>>>
              (v_t + this->begin,v_t + this->CRN,v_t + this->end,__comp);
    RVar2 = MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>::operator()
                      (accessor,v_t + this->FRN);
    input.upper = RVar2.upper;
    input.lower = input.upper;
    hVar3 = Cast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>((Cast *)RVar2.lower,input);
    return hVar3;
  }
  __comp_00._17_7_ = uStack_67;
  __comp_00.desc = bVar1;
  __comp_00.accessor_r = accessor;
  __comp_00.accessor_l = accessor;
  ::std::
  nth_element<duckdb::hugeint_t*,duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>>>
            (v_t + this->begin,v_t + this->FRN,v_t + this->end,__comp_00);
  __comp_01._17_7_ = uStack_7f;
  __comp_01.desc = bVar1;
  __comp_01.accessor_r = accessor;
  __comp_01.accessor_l = accessor;
  ::std::
  nth_element<duckdb::hugeint_t*,duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>>>
            (v_t + this->FRN,v_t + this->CRN,v_t + this->end,__comp_01);
  RVar2 = MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>::operator()
                    (accessor,v_t + this->FRN);
  hVar3.upper = RVar2.upper;
  hVar3.lower = hVar3.upper;
  local_38 = Cast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>((Cast *)RVar2.lower,hVar3);
  RVar2 = MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>::operator()
                    (accessor,v_t + this->CRN);
  input_00.upper = RVar2.upper;
  input_00.lower = input_00.upper;
  local_48 = Cast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>((Cast *)RVar2.lower,input_00);
  hVar3 = CastInterpolation::Interpolate<duckdb::hugeint_t>
                    (&local_38,
                     this->RN -
                     (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                      1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),&local_48);
  return hVar3;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}